

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

error atomic_size<20>(context *ctx,token *token,opcode *op)

{
  int iVar1;
  _Storage<unsigned_long,_true> _Var2;
  ulong *in_RCX;
  string_view prefix;
  optional<unsigned_long> oVar3;
  token local_58;
  
  prefix._M_str = ".";
  prefix._M_len = 1;
  oVar3 = find_in_table((token *)op,atomic_size<20>::table,prefix);
  _Var2._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  if (((undefined1  [16])
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    _Var2._M_value = 0;
  }
  else {
    context::tokenize(&local_58,(context *)token);
    *(int *)&op[2].value = local_58.column;
    op[1].value = (uint64_t)local_58.data.string._M_str;
    op[1].reuse = local_58.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.line;
    op->value = (uint64_t)local_58.filename;
    op->reuse = local_58.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.data.predicate.negated;
    if (_Var2._M_value != 4) {
      if (_Var2._M_value != 3) goto LAB_0012bc76;
      iVar1 = equal((token *)op,".FTZ");
      if (iVar1 == 0) goto LAB_0012bca1;
      context::tokenize(&local_58,(context *)token);
      *(int *)&op[2].value = local_58.column;
      op[1].value = (uint64_t)local_58.data.string._M_str;
      op[1].reuse = local_58.type;
      op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.line;
      op->value = (uint64_t)local_58.filename;
      op->reuse = local_58.data.predicate.index;
      op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.data.predicate.negated;
    }
    iVar1 = equal((token *)op,".RN");
    if (iVar1 == 0) {
LAB_0012bca1:
      fail((token *)ctx,(char *)op,atomic_size<20>::msg);
      return (unique_ptr<char[],_std::default_delete<char[]>_>)
             (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
    }
    context::tokenize(&local_58,(context *)token);
    *(int *)&op[2].value = local_58.column;
    op[1].value = (uint64_t)local_58.data.string._M_str;
    op[1].reuse = local_58.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.line;
    op->value = (uint64_t)local_58.filename;
    op->reuse = local_58.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.data.predicate.negated;
  }
LAB_0012bc76:
  if ((*in_RCX & _Var2._M_value << 0x14) == 0) {
    *in_RCX = *in_RCX | _Var2._M_value << 0x14;
    ctx->pc = 0;
    return (unique_ptr<char[],_std::default_delete<char[]>_>)
           (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
  }
  __assert_fail("(value & bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                ,0x31,"void opcode::add_bits(uint64_t)");
}

Assistant:

DEFINE_OPERAND(atomic_size)
{
    static const char* msg = "expected .U32, .S32, .U64, .S64, .F32.FTZ.RN, .F16x2.RN or .S64";
    static const char* table[] = {"U32", "S32", "U64", "F32", "F16x2", "S64", nullptr};
    const std::optional<uint64_t> result = find_in_table(token, table, ".");
    if (result) {
        token = ctx.tokenize();
        switch (*result) {
        case 3: // .F32.FTZ.RN
            if (!equal(token, ".FTZ")) {
                return fail(token, msg);
            }
            token = ctx.tokenize();
            [[fallthrough]];
        case 4: // .F16x2.RN
            if (!equal(token, ".RN")) {
                return fail(token, msg);
            }
            token = ctx.tokenize();
        }
    }
    op.add_bits(result.value_or(0) << address);
    return {};
}